

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall DecisionNode::orderPatterns(DecisionNode *this,DecisionProperties *props)

{
  DisjointPattern *pDVar1;
  DisjointPattern *pDVar2;
  DisjointPattern *this_00;
  bool bVar3;
  pointer ppVar4;
  pointer ppVar5;
  ulong uVar6;
  Constructor *pCVar7;
  Constructor *pCVar8;
  undefined8 *puVar9;
  ulong uVar10;
  Constructor *pCVar11;
  Constructor *pCVar12;
  long lVar13;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  conflictlist;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  newlist;
  pair<DisjointPattern_*,_Constructor_*> *local_98;
  iterator iStack_90;
  pair<DisjointPattern_*,_Constructor_*> *local_88;
  Constructor *local_78;
  pair<DisjointPattern_*,_Constructor_*> local_70;
  DecisionProperties *local_60;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  local_58;
  long local_38;
  
  local_58.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  local_98 = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  iStack_90._M_current = (pair<DisjointPattern_*,_Constructor_*> *)0x0;
  ppVar4 = (this->list).
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->list).
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = props;
  if (ppVar5 != ppVar4) {
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        lVar13 = 0;
        uVar10 = uVar6;
        do {
          ppVar4 = (this->list).
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = DisjointPattern::identical
                            (ppVar4[uVar6].first,
                             *(DisjointPattern **)((long)&ppVar4->first + lVar13));
          if (bVar3) {
            ppVar4 = (this->list).
                     super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            DecisionProperties::identicalPattern
                      (local_60,ppVar4[uVar6].second,
                       *(Constructor **)((long)&ppVar4->second + lVar13));
          }
          lVar13 = lVar13 + 0x10;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        ppVar4 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)ppVar5 - (long)ppVar4 >> 4));
  }
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::operator=(&local_58,&this->list);
  ppVar4 = (this->list).
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->list).
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    lVar13 = 0;
    pCVar7 = (Constructor *)0x0;
    do {
      pCVar11 = (Constructor *)0x0;
      pCVar8 = pCVar7;
      local_38 = lVar13;
      if (pCVar7 != (Constructor *)0x0) {
        lVar13 = 0;
        pCVar12 = (Constructor *)0x0;
        local_78 = pCVar7;
        do {
          pCVar8 = local_78;
          pDVar1 = local_58.
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pCVar7].first;
          pDVar2 = *(DisjointPattern **)
                    ((long)&((this->list).
                             super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar13);
          bVar3 = DisjointPattern::specializes(pDVar1,pDVar2);
          pCVar11 = pCVar12;
          if (bVar3) break;
          bVar3 = DisjointPattern::specializes(pDVar2,pDVar1);
          if (!bVar3) {
            pCVar8 = local_58.
                     super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pCVar7].second;
            pCVar11 = *(Constructor **)
                       ((long)&((this->list).
                                super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second + lVar13);
            if (pCVar8 != pCVar11) {
              if (iStack_90._M_current == local_88) {
                local_70.first = pDVar1;
                local_70.second = pCVar8;
                std::
                vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                ::_M_realloc_insert<std::pair<DisjointPattern*,Constructor*>>
                          ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                            *)&local_98,iStack_90,&local_70);
              }
              else {
                (iStack_90._M_current)->first = pDVar1;
                (iStack_90._M_current)->second = pCVar8;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
              local_70.first = pDVar2;
              local_70.second = pCVar11;
              if (iStack_90._M_current == local_88) {
                std::
                vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                ::_M_realloc_insert<std::pair<DisjointPattern*,Constructor*>>
                          ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                            *)&local_98,iStack_90,&local_70);
              }
              else {
                (iStack_90._M_current)->first = pDVar2;
                (iStack_90._M_current)->second = pCVar11;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
          }
          pCVar12 = (Constructor *)((long)&pCVar12->pattern + 1);
          lVar13 = lVar13 + 0x10;
          pCVar8 = local_78;
          pCVar11 = local_78;
        } while (local_78 != pCVar12);
        ppVar4 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      if ((Constructor *)((ulong)pCVar11 & 0xffffffff) < pCVar8) {
        puVar9 = (undefined8 *)((long)&ppVar4->first + local_38);
        pCVar7 = pCVar8;
        do {
          pCVar7 = (Constructor *)&pCVar7[-1].field_0x97;
          *puVar9 = puVar9[-2];
          puVar9[1] = puVar9[-1];
          puVar9 = puVar9 + -2;
        } while ((long)(int)pCVar11 < (long)pCVar7);
      }
      pCVar7 = local_58.
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pCVar8].second;
      ppVar4[(long)((ulong)pCVar11 & 0xffffffff)].first =
           local_58.
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)pCVar8].first;
      ppVar4[(long)((ulong)pCVar11 & 0xffffffff)].second = pCVar7;
      pCVar7 = (Constructor *)((long)&pCVar8->pattern + 1);
      lVar13 = local_38 + 0x10;
    } while (pCVar7 < (Constructor *)
                      ((long)(this->list).
                             super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4));
  }
  if (iStack_90._M_current != local_98) {
    uVar6 = 0;
    do {
      pCVar7 = local_98[uVar6].second;
      local_78 = local_98[uVar6 + 1].second;
      ppVar4 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->list).
          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
        pDVar1 = local_98[uVar6].first;
        pDVar2 = local_98[uVar6 + 1].first;
        lVar13 = 8;
        uVar10 = 0;
        do {
          this_00 = *(DisjointPattern **)((long)ppVar4 + lVar13 + -8);
          pCVar8 = *(Constructor **)((long)&ppVar4->first + lVar13);
          if (((this_00 == pDVar1) && (pCVar8 == pCVar7)) ||
             ((this_00 == pDVar2 && (pCVar8 == local_78)))) break;
          bVar3 = DisjointPattern::resolvesIntersect(this_00,pDVar1,pDVar2);
          if (bVar3) goto LAB_00324231;
          uVar10 = uVar10 + 1;
          ppVar4 = (this->list).
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 0x10;
        } while (uVar10 < (ulong)((long)(this->list).
                                        super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >>
                                 4));
      }
      DecisionProperties::conflictingPattern(local_60,pCVar7,local_78);
LAB_00324231:
      uVar6 = uVar6 + 2;
    } while (uVar6 < (ulong)((long)iStack_90._M_current - (long)local_98 >> 4));
  }
  if (local_98 != (pair<DisjointPattern_*,_Constructor_*> *)0x0) {
    operator_delete(local_98);
  }
  if (local_58.
      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DecisionNode::orderPatterns(DecisionProperties &props)

{
  // This is a tricky routine.  When this routine is called, the patterns remaining in the
  // the decision node can no longer be distinguished by examining additional bits. The basic
  // idea here is that the patterns should be ordered so that the most specialized should come
  // first in the list. Pattern 1 is a specialization of pattern 2, if the set of instructions
  // matching 1 is contained in the set matching 2.  So in the simplest case, the pattern order
  // should represent a strict nesting.  Unfortunately, there are many potential situations where
  // patterns don't necessarily nest.
  //   1) An "or" of two patterns.  This can be an explicit '|' operator in the Constructor, in
  //      which case this can be detected because the two patterns point to the same constructor
  //      But the "or" can be implied across two constructors that do the same thing.  This should
  //      probably be flagged as an error except in the following case.
  //   2) Two patterns aren't properly nested, but they are "resolved" by a third pattern which
  //      covers the intersection of the first two patterns.  Sometimes its easier to specify
  //      three cases that need to be distinguished in this way.
  //   3) Recursive constructors that use a "guard" context bit.  The guard bit is used to prevent
  //      the recursive constructor from matching repeatedly, but it's too much work to put a
  //      constraint an the bit for every other pattern.
  //   4) Other situations where the ability to distinguish between constructors is hidden in
  //      the subconstructors.
  // This routine can determine if an intersection results from case 1) or case 2)
  int4 i,j,k;
  vector<pair<DisjointPattern *,Constructor *> > newlist;
  vector<pair<DisjointPattern *,Constructor *> > conflictlist;

  // Check for identical patterns
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = list[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->identical(jpat))
	props.identicalPattern(list[i].second,list[j].second);
    }
  }

  newlist = list;
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = newlist[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->specializes(jpat))
	break;
      if (!jpat->specializes(ipat)) { // We have a potential conflict
	Constructor *iconst = newlist[i].second;
	Constructor *jconst = list[j].second;
	if (iconst == jconst) { // This is an OR in the pattern for ONE constructor
	  // So there is no conflict
	}
	else {			// A true conflict that needs to be resolved
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(ipat,iconst));
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(jpat,jconst));
	}
      }
    }
    for(k=i-1;k>=j;--k)
      list[k+1] = list[k];
    list[j] = newlist[i];
  }
  
  // Check if intersection patterns are present, which resolve conflicts
  for(i=0;i<conflictlist.size();i+=2) {
    DisjointPattern *pat1,*pat2;
    Constructor *const1,*const2;
    pat1 = conflictlist[i].first;
    const1 = conflictlist[i].second;
    pat2 = conflictlist[i+1].first;
    const2 = conflictlist[i+1].second;
    bool resolved = false;
    for(j=0;j<list.size();++j) {
      DisjointPattern *tpat = list[j].first;
      Constructor *tconst = list[j].second;
      if ((tpat == pat1)&&(tconst==const1)) break; // Ran out of possible specializations
      if ((tpat == pat2)&&(tconst==const2)) break;
      if (tpat->resolvesIntersect(pat1,pat2)) {
	resolved = true;
	break;
      }
    }
    if (!resolved)
      props.conflictingPattern(const1,const2);
  }
}